

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O0

void set_socket_both_buffer_sizes(int socket_fd)

{
  Direction unaff_retaddr;
  
  set_socket_buffer_size(socket_fd,unaff_retaddr);
  set_socket_buffer_size(socket_fd,unaff_retaddr);
  return;
}

Assistant:

void set_socket_both_buffer_sizes(int socket_fd) {
	// clang-format off
	set_socket_buffer_size(
		socket_fd,
		SEND
	 );

	set_socket_buffer_size(
		socket_fd,
		RECEIVE
	 );
	// clang-format on
}